

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void NtoS(int n,tmbstr str)

{
  int iVar1;
  int local_4c;
  char acStack_48 [4];
  int i;
  tmbchar buf [40];
  tmbstr str_local;
  int n_local;
  
  local_4c = 0;
  str_local._4_4_ = n;
  while( true ) {
    iVar1 = local_4c;
    acStack_48[local_4c] = (char)(str_local._4_4_ % 10) + '0';
    str_local._4_4_ = str_local._4_4_ / 10;
    if (str_local._4_4_ == 0) break;
    local_4c = local_4c + 1;
  }
  for (; -1 < local_4c; local_4c = local_4c + -1) {
    str[iVar1 - local_4c] = acStack_48[local_4c];
  }
  str[iVar1 + 1] = '\0';
  return;
}

Assistant:

static void NtoS(int n, tmbstr str)
{
    tmbchar buf[40];
    int i;
    
    for (i = 0;; ++i)
    {
        buf[i] = (tmbchar)( (n % 10) + '0' );
        
        n = n / 10;
        
        if (n == 0)
            break;
    }
    
    n = i;
    
    while (i >= 0)
    {
        str[n-i] = buf[i];
        --i;
    }
    
    str[n+1] = '\0';
}